

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_a7919c::HandleRelativePathCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  string_view value;
  cmExecutionStatus *this;
  bool bVar2;
  size_type sVar3;
  const_reference name;
  const_reference in_name;
  const_reference in_name_00;
  cmMakefile *this_00;
  undefined1 local_d0 [8];
  string res;
  string errstring_1;
  string errstring;
  string *fileName;
  string *directoryName;
  string *outVar;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  this = local_20;
  if (sVar3 == 4) {
    name = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)status_local,1);
    in_name = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)status_local,2);
    in_name_00 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,3);
    bVar2 = cmsys::SystemTools::FileIsFullPath(in_name);
    if (bVar2) {
      bVar2 = cmsys::SystemTools::FileIsFullPath(in_name_00);
      if (bVar2) {
        cmSystemTools::RelativePath((string *)local_d0,in_name,in_name_00);
        this_00 = cmExecutionStatus::GetMakefile(local_20);
        value = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_d0);
        cmMakefile::AddDefinition(this_00,name,value);
        args_local._7_1_ = 1;
        std::__cxx11::string::~string((string *)local_d0);
      }
      else {
        pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&res.field_2 + 8);
        std::operator+(pbVar1,"RELATIVE_PATH must be passed a full path to the file: ",in_name_00);
        cmExecutionStatus::SetError(local_20,pbVar1);
        args_local._7_1_ = 0;
        std::__cxx11::string::~string((string *)(res.field_2._M_local_buf + 8));
      }
    }
    else {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&errstring_1.field_2 + 8);
      std::operator+(pbVar1,"RELATIVE_PATH must be passed a full path to the directory: ",in_name);
      cmExecutionStatus::SetError(local_20,pbVar1);
      args_local._7_1_ = 0;
      std::__cxx11::string::~string((string *)(errstring_1.field_2._M_local_buf + 8));
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"RELATIVE_PATH called with incorrect number of arguments",
               &local_41);
    cmExecutionStatus::SetError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleRelativePathCommand(std::vector<std::string> const& args,
                               cmExecutionStatus& status)
{
  if (args.size() != 4) {
    status.SetError("RELATIVE_PATH called with incorrect number of arguments");
    return false;
  }

  const std::string& outVar = args[1];
  const std::string& directoryName = args[2];
  const std::string& fileName = args[3];

  if (!cmSystemTools::FileIsFullPath(directoryName)) {
    std::string errstring =
      "RELATIVE_PATH must be passed a full path to the directory: " +
      directoryName;
    status.SetError(errstring);
    return false;
  }
  if (!cmSystemTools::FileIsFullPath(fileName)) {
    std::string errstring =
      "RELATIVE_PATH must be passed a full path to the file: " + fileName;
    status.SetError(errstring);
    return false;
  }

  std::string res = cmSystemTools::RelativePath(directoryName, fileName);
  status.GetMakefile().AddDefinition(outVar, res);
  return true;
}